

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O1

bool cmCTestSVNPathStarts(string *p1,string *p2)

{
  ulong __n;
  ulong __n_00;
  char *__s1;
  int iVar1;
  
  __n = p1->_M_string_length;
  __n_00 = p2->_M_string_length;
  if (__n == __n_00) {
    if (__n == 0) {
      return true;
    }
    iVar1 = bcmp((p1->_M_dataplus)._M_p,(p2->_M_dataplus)._M_p,__n);
  }
  else {
    if ((__n <= __n_00) || (__s1 = (p1->_M_dataplus)._M_p, __s1[__n_00] != '/')) {
      return false;
    }
    iVar1 = strncmp(__s1,(p2->_M_dataplus)._M_p,__n_00);
  }
  return iVar1 == 0;
}

Assistant:

static bool cmCTestSVNPathStarts(std::string const& p1, std::string const& p2)
{
  // Does path p1 start with path p2?
  if (p1.size() == p2.size()) {
    return p1 == p2;
  }
  if (p1.size() > p2.size() && p1[p2.size()] == '/') {
    return strncmp(p1.c_str(), p2.c_str(), p2.size()) == 0;
  }
  return false;
}